

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

PatchList re2::PatchList::Deref(Inst *inst0,PatchList l)

{
  Inst *pIVar1;
  PatchList PVar2;
  
  if ((l.p & 1) == 0) {
    return (PatchList)(inst0[l.p >> 1].out_opcode_ >> 4);
  }
  pIVar1 = inst0 + (l.p >> 1);
  PVar2.p._0_1_ = *(uint8_t *)&pIVar1->field_1;
  PVar2.p._1_1_ = *(uint8_t *)((long)&pIVar1->field_1 + 1);
  PVar2.p._2_2_ = *(uint16_t *)((long)&pIVar1->field_1 + 2);
  return (PatchList)PVar2.p;
}

Assistant:

PatchList PatchList::Deref(Prog::Inst* inst0, PatchList l) {
  Prog::Inst* ip = &inst0[l.p>>1];
  if (l.p&1)
    l.p = ip->out1();
  else
    l.p = ip->out();
  return l;
}